

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int count,float items_height)

{
  int iVar1;
  
  this->StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
  this->ItemsHeight = items_height;
  this->ItemsCount = count;
  this->StepNo = 0;
  this->DisplayStart = -1;
  this->DisplayEnd = -1;
  if (0.0 < items_height) {
    ImGui::CalcListClipping(count,items_height,&this->DisplayStart,&this->DisplayEnd);
    iVar1 = this->DisplayStart;
    if (0 < iVar1) {
      SetCursorPosYAndSetupDummyPrevLine
                ((float)iVar1 * this->ItemsHeight + this->StartPosY,this->ItemsHeight);
    }
    this->StepNo = 2;
  }
  return;
}

Assistant:

void ImGuiListClipper::Begin(int count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = count;
    StepNo = 0;
    DisplayEnd = DisplayStart = -1;
    if (ItemsHeight > 0.0f)
    {
        ImGui::CalcListClipping(ItemsCount, ItemsHeight, &DisplayStart, &DisplayEnd); // calculate how many to clip/display
        if (DisplayStart > 0)
            SetCursorPosYAndSetupDummyPrevLine(StartPosY + DisplayStart * ItemsHeight, ItemsHeight); // advance cursor
        StepNo = 2;
    }
}